

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O0

void __thiscall QTabWidget::clear(QTabWidget *this)

{
  int index;
  QTabWidgetPrivate *this_00;
  QLayout *in_RDI;
  int c;
  QTabWidgetPrivate *d;
  QLayout *in_stack_00000050;
  undefined1 in_stack_ffffffffffffffdf;
  undefined4 in_stack_ffffffffffffffec;
  undefined1 enable;
  
  enable = (undefined1)((uint)in_stack_ffffffffffffffec >> 0x18);
  this_00 = d_func((QTabWidget *)0x6e8d4c);
  QWidget::layout((QWidget *)0x6e8d62);
  QLayout::setEnabled(in_RDI,(bool)in_stack_ffffffffffffffdf);
  QWidget::setUpdatesEnabled((QWidget *)this_00,(bool)enable);
  QWidget::setUpdatesEnabled((QWidget *)this_00,(bool)enable);
  index = count((QTabWidget *)in_RDI);
  while (index != 0) {
    index = index + -1;
    removeTab((QTabWidget *)this_00,index);
  }
  QWidget::setUpdatesEnabled((QWidget *)this_00,false);
  QWidget::setUpdatesEnabled((QWidget *)this_00,SUB41((uint)index >> 0x18,0));
  QWidget::layout((QWidget *)0x6e8dfb);
  QLayout::setEnabled(in_RDI,(bool)in_stack_ffffffffffffffdf);
  QWidget::layout((QWidget *)0x6e8e19);
  QLayout::activate(in_stack_00000050);
  return;
}

Assistant:

void QTabWidget::clear()
{
    Q_D(QTabWidget);
    Q_ASSERT(d->stack->layout());
    d->stack->layout()->setEnabled(false);
    d->stack->setUpdatesEnabled(false);
    d->tabs->setUpdatesEnabled(false);

    int c = count();
    while (c)
        removeTab(--c);

    d->tabs->setUpdatesEnabled(true);
    d->stack->setUpdatesEnabled(true);
    d->stack->layout()->setEnabled(true);
    d->stack->layout()->activate();
}